

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder.c
# Opt level: O0

lzma_ret lz_encoder_update(lzma_coder_conflict14 *coder,lzma_allocator *allocator,
                          lzma_filter *filters_null,lzma_filter *reversed_filters)

{
  lzma_ret ret_;
  lzma_filter *reversed_filters_local;
  lzma_filter *filters_null_local;
  lzma_allocator *allocator_local;
  lzma_coder_conflict14 *coder_local;
  
  if ((coder->lz).options_update == (_func_lzma_ret_lzma_coder_ptr_lzma_filter_ptr_conflict1 *)0x0)
  {
    coder_local._4_4_ = LZMA_PROG_ERROR;
  }
  else {
    coder_local._4_4_ = (*(coder->lz).options_update)((coder->lz).coder,reversed_filters);
    if (coder_local._4_4_ == LZMA_OK) {
      coder_local._4_4_ =
           lzma_next_filter_update((lzma_next_coder *)&coder->next,allocator,reversed_filters + 1);
    }
  }
  return coder_local._4_4_;
}

Assistant:

static lzma_ret
lz_encoder_update(lzma_coder *coder, lzma_allocator *allocator,
		const lzma_filter *filters_null lzma_attribute((__unused__)),
		const lzma_filter *reversed_filters)
{
	if (coder->lz.options_update == NULL)
		return LZMA_PROG_ERROR;

	return_if_error(coder->lz.options_update(
			coder->lz.coder, reversed_filters));

	return lzma_next_filter_update(
			&coder->next, allocator, reversed_filters + 1);
}